

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Deserializer::GetAbsoluteSteps
          (BP5Deserializer *this,VariableBase *Var,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *keys)

{
  BP5VarRec *VarRec;
  size_t sVar1;
  void *pvVar2;
  size_t WriterRank;
  ulong WriterRank_00;
  size_t Step;
  size_t local_38;
  
  VarRec = LookupVarByKey(this,Var);
  if (this->m_RandomAccessMode == true) {
    local_38 = 0;
    while (local_38 <
           (ulong)(((long)(this->m_ControlArray).
                          super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_ControlArray).
                         super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      WriterRank_00 = 0;
      do {
        Step = local_38;
        sVar1 = WriterCohortSize(this,local_38);
        if (sVar1 <= WriterRank_00) goto LAB_005dd721;
        pvVar2 = GetMetadataBase(this,VarRec,Step,WriterRank_00);
        WriterRank_00 = WriterRank_00 + 1;
      } while (pvVar2 == (void *)0x0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(keys,&local_38);
      Step = local_38;
LAB_005dd721:
      local_38 = Step + 1;
    }
  }
  return;
}

Assistant:

void BP5Deserializer::GetAbsoluteSteps(const VariableBase &Var, std::vector<size_t> &keys) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!m_RandomAccessMode)
        return;

    for (size_t Step = 0; Step < m_ControlArray.size(); Step++)
    {
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(Step); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
            if (writer_meta_base)
            {
                keys.push_back(Step);
                break;
            }
        }
    }
}